

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O0

int x509_csr_get_version(uchar **p,uchar *end,int *ver)

{
  int iVar1;
  int ret;
  int *ver_local;
  uchar *end_local;
  uchar **p_local;
  
  iVar1 = mbedtls_asn1_get_int(p,end,ver);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else if (iVar1 == -0x62) {
    *ver = 0;
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = iVar1 + -0x2200;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_csr_get_version( unsigned char **p,
                             const unsigned char *end,
                             int *ver )
{
    int ret;

    if( ( ret = mbedtls_asn1_get_int( p, end, ver ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            *ver = 0;
            return( 0 );
        }

        return( MBEDTLS_ERR_X509_INVALID_VERSION + ret );
    }

    return( 0 );
}